

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O1

OperatorResultType __thiscall
duckdb::PhysicalPiecewiseMergeJoin::ResolveComplexJoin
          (PhysicalPiecewiseMergeJoin *this,ExecutionContext *context,DataChunk *input,
          DataChunk *chunk,OperatorState *state_p)

{
  bool bVar1;
  BufferHandle *pBVar2;
  BufferHandle *pBVar3;
  idx_t iVar4;
  idx_t iVar5;
  __int_type _Var6;
  __int_type _Var7;
  sel_t *psVar8;
  int iVar9;
  int iVar10;
  pointer pGVar11;
  reference pvVar12;
  reference pvVar13;
  type pRVar14;
  const_reference pvVar15;
  data_ptr_t pdVar16;
  reference pvVar17;
  reference other;
  SelectionVector *sel;
  ulong uVar18;
  pointer pRVar19;
  _func_int **pp_Var20;
  byte bVar21;
  ulong uVar22;
  ulong count;
  pointer this_00;
  idx_t i_1;
  BufferHandle *this_01;
  size_type sVar23;
  _func_int **pp_Var24;
  bool external;
  data_ptr_t l_ptr;
  BlockMergeInfo right_info;
  BlockMergeInfo left_info;
  SBScanState lread;
  SBScanState rread;
  bool local_2b1;
  DataChunk *local_2b0;
  data_ptr_t local_2a8;
  idx_t local_2a0;
  pointer local_298;
  DataChunk *local_290;
  type local_288;
  PhysicalPiecewiseMergeJoin *local_280;
  SelectionVector *local_278;
  data_ptr_t local_270;
  GlobalSortState *local_268;
  _func_int **local_260;
  _func_int **local_258;
  OperatorState *local_250;
  SelectionVector local_248;
  type local_230;
  idx_t local_228;
  _func_int **local_220;
  OperatorState *local_218;
  SelectionVector local_210;
  OperatorState *local_1f8;
  DataChunk *local_1f0;
  vector<duckdb::JoinCondition,_true> *local_1e8;
  type local_1e0;
  DataChunk *local_1d8;
  DataChunk *local_1d0;
  long local_1c8;
  vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *local_1c0;
  BufferHandle *local_1b8;
  BufferHandle *local_1b0;
  OperatorState *local_1a8;
  OperatorState *local_1a0;
  OperatorState *local_198;
  size_t local_190;
  ExpressionExecutor *local_188;
  undefined1 local_180 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  _func_int **local_158;
  BufferHandle local_150;
  BufferHandle local_138;
  BufferHandle local_120;
  BufferHandle local_108;
  BufferHandle BStack_f0;
  SBScanState local_d8;
  
  local_2b0 = chunk;
  local_298 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
              ::operator->(&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                            super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                            sink_state);
  local_298 = local_298 + 1;
  pGVar11 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
            ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                          *)local_298);
  pvVar12 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
            ::operator[](&(pGVar11->global_sort_state).sorted_blocks,0);
  local_288 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
              operator*(pvVar12);
  local_2a0 = (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  local_1c8 = (long)*(pointer *)
                     ((long)&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions
                             .
                             super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                             .
                             super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                             ._M_impl.super__Vector_impl_data + 8) -
              (long)(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions.
                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (BufferHandle *)state_p[0x46]._vptr_OperatorState;
  pBVar3 = (BufferHandle *)state_p[0x47]._vptr_OperatorState;
  this_01 = pBVar2;
  local_280 = this;
  local_1d0 = input;
  if (pBVar3 != pBVar2) {
    do {
      BufferHandle::~BufferHandle(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != pBVar3);
    state_p[0x47]._vptr_OperatorState = (_func_int **)pBVar2;
  }
  local_2a0 = local_2a0 * 0x4ec4ec4ec4ec4ec5;
  local_1e8 = &(local_280->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions;
  local_1c0 = (vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
              (state_p + 0x46);
  local_1f8 = state_p + 0x26;
  local_198 = state_p + 0x21;
  local_1a0 = state_p + 0x22;
  local_1a8 = state_p + 0x24;
  local_1b8 = &local_d8.payload_heap_handle;
  local_1b0 = &BStack_f0;
  local_1d8 = (DataChunk *)(state_p + 8);
  local_290 = (DataChunk *)(state_p + 0x35);
  local_188 = (ExpressionExecutor *)(state_p + 0x3d);
  local_1f0 = (DataChunk *)(state_p + 0x2d);
  local_278 = (SelectionVector *)(state_p + 0x2a);
  this_00 = local_298;
  do {
    if (*(char *)&state_p[0x25]._vptr_OperatorState == '\x01') {
      PiecewiseMergeJoinState::ResolveJoinKeys((PiecewiseMergeJoinState *)state_p,local_1d0);
      state_p[0x24]._vptr_OperatorState = (_func_int **)0x0;
      *(undefined2 *)&state_p[0x25]._vptr_OperatorState = 0;
      local_1f8[2]._vptr_OperatorState = (_func_int **)0x0;
      local_1f8[3]._vptr_OperatorState = (_func_int **)0x0;
      local_1f8->_vptr_OperatorState = (_func_int **)0x0;
      local_1f8[1]._vptr_OperatorState = (_func_int **)0x0;
    }
    if (*(char *)((long)&state_p[0x25]._vptr_OperatorState + 1) == '\x01') {
      if ((*(char *)&state_p[0x10]._vptr_OperatorState == '\x01') &&
         (OuterJoinMarker::ConstructLeftJoinResult
                    ((OuterJoinMarker *)(state_p + 0x10),local_1d8,local_2b0),
         *(char *)&state_p[0x10]._vptr_OperatorState == '\x01')) {
        switchD_0105dc25::default
                  (state_p[0x11]._vptr_OperatorState,0,(size_t)state_p[0x12]._vptr_OperatorState);
      }
      *(undefined2 *)&state_p[0x25]._vptr_OperatorState = 1;
      return NEED_MORE_INPUT;
    }
    local_1e0 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
                ::operator*((unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
                             *)local_198);
    iVar4 = local_1e0->count;
    iVar5 = local_1e0->has_null;
    local_230 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                ::operator*((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                             *)local_1a0);
    local_228 = 0;
    local_218 = local_1a8;
    local_220 = (_func_int **)(iVar4 - iVar5);
    SelectionVector::SelectionVector(&local_210,0x800);
    pvVar13 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
              ::operator[](&local_288->radix_sorting_data,
                           (size_type)state_p[0x27]._vptr_OperatorState);
    pRVar14 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
              operator*(pvVar13);
    pp_Var20 = state_p[0x28]._vptr_OperatorState;
    iVar4 = pRVar14->count;
    pGVar11 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
              ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                            *)this_00);
    _Var6 = (pGVar11->count).super___atomic_base<unsigned_long>._M_i;
    pGVar11 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
              ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                            *)this_00);
    _Var7 = (pGVar11->has_null).super___atomic_base<unsigned_long>._M_i;
    pGVar11 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
              ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                            *)this_00);
    pp_Var24 = (_func_int **)(iVar4 + (long)pp_Var20);
    local_258 = (_func_int **)(_Var6 - _Var7);
    if (local_258 < pp_Var20) {
      local_258 = pp_Var20;
    }
    if (pp_Var24 < local_258) {
      local_258 = pp_Var24;
    }
    local_258 = (_func_int **)((long)local_258 - (long)pp_Var20);
    local_268 = &pGVar11->global_sort_state;
    local_260 = state_p[0x27]._vptr_OperatorState;
    local_250 = local_1f8;
    SelectionVector::SelectionVector(&local_248,0x800);
    pvVar15 = vector<duckdb::JoinCondition,_true>::operator[](local_1e8,0);
    this_00 = local_298;
    iVar9 = MergeJoinComparisonValue(pvVar15->comparison);
    bVar1 = (local_268->sort_layout).all_constant;
    local_2b1 = local_230->external;
    SBScanState::SBScanState((SBScanState *)local_180,local_230->buffer_manager,local_230);
    pvVar12 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
              ::operator[](&local_230->sorted_blocks,0);
    local_168._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (pvVar12->super_unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>)
         ._M_t.super___uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>.
         super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl;
    MergeJoinPinSortingBlock((SBScanState *)local_180,local_228);
    local_158 = (_func_int **)0x0;
    pdVar16 = SBScanState::RadixPtr((SBScanState *)local_180);
    local_158 = local_218->_vptr_OperatorState;
    local_2a8 = SBScanState::RadixPtr((SBScanState *)local_180);
    SBScanState::SBScanState(&local_d8,local_268->buffer_manager,local_268);
    pvVar12 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
              ::operator[](&local_268->sorted_blocks,0);
    local_d8.sb = (pvVar12->
                  super_unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>).
                  _M_t.
                  super___uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
                  .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl;
    if (local_250->_vptr_OperatorState < local_258) {
      MergeJoinPinSortingBlock(&local_d8,(idx_t)local_260);
      local_d8.entry_idx = (idx_t)local_250->_vptr_OperatorState;
      local_270 = SBScanState::RadixPtr(&local_d8);
      local_190 = (local_230->sort_layout).comparison_size;
      iVar4 = (local_230->sort_layout).entry_size;
      count = 0;
LAB_016ce72c:
      do {
        pp_Var20 = local_218->_vptr_OperatorState;
        if (state_p[0x29]._vptr_OperatorState <= pp_Var20) {
          if (pp_Var20 < local_220) {
            if (bVar1 == false) {
              local_d8.entry_idx = (idx_t)local_250->_vptr_OperatorState;
              local_158 = pp_Var20;
              iVar10 = Comparators::CompareTuple
                                 ((SBScanState *)local_180,&local_d8,&local_2a8,&local_270,
                                  &local_230->sort_layout,&local_2b1);
            }
            else {
              iVar10 = FastMemcmp(local_2a8,local_270,local_190);
            }
            bVar21 = 0;
            if (iVar10 <= iVar9) {
              pp_Var20 = local_218->_vptr_OperatorState;
              local_210.sel_vector[count] = (sel_t)pp_Var20;
              local_248.sel_vector[count] = *(sel_t *)&local_250->_vptr_OperatorState;
              count = count + 1;
              local_218->_vptr_OperatorState = (_func_int **)((long)pp_Var20 + 1);
              local_2a8 = local_2a8 + iVar4;
              bVar21 = count == 0x800 | 2;
            }
            if (bVar21 != 0) {
              this_00 = local_298;
              if (bVar21 != 2) goto LAB_016ce893;
              goto LAB_016ce72c;
            }
          }
          state_p[0x29]._vptr_OperatorState = local_218->_vptr_OperatorState;
          pp_Var20 = (_func_int **)((long)local_250->_vptr_OperatorState + 1);
          local_250->_vptr_OperatorState = pp_Var20;
          this_00 = local_298;
          if (local_258 <= pp_Var20) goto LAB_016ce893;
          local_270 = local_270 + iVar4;
          local_218->_vptr_OperatorState = (_func_int **)0x0;
          local_2a8 = pdVar16;
          goto LAB_016ce72c;
        }
        local_210.sel_vector[count] = (sel_t)pp_Var20;
        local_248.sel_vector[count] = *(sel_t *)&local_250->_vptr_OperatorState;
        count = count + 1;
        local_218->_vptr_OperatorState = (_func_int **)((long)pp_Var20 + 1);
        local_2a8 = local_2a8 + iVar4;
      } while (count != 0x800);
      count = 0x800;
      this_00 = local_298;
    }
    else {
      count = 0;
    }
LAB_016ce893:
    BufferHandle::~BufferHandle(local_1b8);
    BufferHandle::~BufferHandle(&local_d8.payload_data_handle);
    BufferHandle::~BufferHandle(&local_d8.blob_sorting_heap_handle);
    BufferHandle::~BufferHandle(&local_d8.blob_sorting_data_handle);
    BufferHandle::~BufferHandle(&local_d8.radix_handle);
    BufferHandle::~BufferHandle(local_1b0);
    BufferHandle::~BufferHandle(&local_108);
    BufferHandle::~BufferHandle(&local_120);
    BufferHandle::~BufferHandle(&local_138);
    BufferHandle::~BufferHandle(&local_150);
    if (count == 0) {
      state_p[0x24]._vptr_OperatorState = (_func_int **)0x0;
      state_p[0x26]._vptr_OperatorState = (_func_int **)0x0;
      pvVar13 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                ::operator[](&local_288->radix_sorting_data,
                             (size_type)state_p[0x27]._vptr_OperatorState);
      pRVar19 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                operator->(pvVar13);
      state_p[0x28]._vptr_OperatorState =
           (_func_int **)((long)state_p[0x28]._vptr_OperatorState + pRVar19->count);
      pp_Var20 = (_func_int **)((long)state_p[0x27]._vptr_OperatorState + 1);
      state_p[0x27]._vptr_OperatorState = pp_Var20;
      if ((_func_int **)
          ((long)(local_288->radix_sorting_data).
                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(local_288->radix_sorting_data).
                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) <= pp_Var20) {
        *(undefined1 *)((long)&state_p[0x25]._vptr_OperatorState + 1) = 1;
      }
    }
    else {
      DataChunk::Reset(local_2b0);
      if (state_p[9]._vptr_OperatorState != state_p[8]._vptr_OperatorState) {
        sVar23 = 0;
        do {
          pvVar17 = vector<duckdb::Vector,_true>::operator[](&local_2b0->data,sVar23);
          other = vector<duckdb::Vector,_true>::operator[](&local_1d8->data,sVar23);
          Vector::Slice(pvVar17,other,&local_210,count);
          sVar23 = sVar23 + 1;
        } while (sVar23 < (ulong)(((long)state_p[9]._vptr_OperatorState -
                                   (long)state_p[8]._vptr_OperatorState >> 3) * 0x4ec4ec4ec4ec4ec5))
        ;
      }
      PhysicalRangeJoin::SliceSortedPayload
                ((BufferHandle *)local_180,local_2b0,local_268,(idx_t)local_260,&local_248,count,
                 local_2a0);
      ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::
      emplace_back<duckdb::BufferHandle>(local_1c0,(BufferHandle *)local_180);
      BufferHandle::~BufferHandle((BufferHandle *)local_180);
      local_2b0->count = count;
      sel = FlatVector::IncrementalSelectionVector();
      if (local_1c8 != 0x18) {
        DataChunk::Split(local_2b0,local_290,local_2a0);
        state_p[0x40]._vptr_OperatorState = (_func_int **)local_290;
        DataChunk::Reset(local_1f0);
        uVar18 = count;
        if (1 < (ulong)(((long)*(pointer *)
                                ((long)&(local_280->super_PhysicalRangeJoin).
                                        super_PhysicalComparisonJoin.conditions.
                                        super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                        .
                                        super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                        ._M_impl.super__Vector_impl_data + 8) -
                         (long)(local_280->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                               conditions.
                               super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                               .
                               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       )) {
          local_1e0 = (type)&local_1e0->keys;
          sVar23 = 1;
          do {
            pvVar17 = vector<duckdb::Vector,_true>::operator[]
                                ((vector<duckdb::Vector,_true> *)local_1e0,sVar23);
            Vector::Vector((Vector *)local_180,pvVar17);
            Vector::Slice((Vector *)local_180,&local_210,count);
            pvVar17 = vector<duckdb::Vector,_true>::operator[](&local_1f0->data,sVar23);
            ExpressionExecutor::ExecuteExpression(local_188,sVar23,pvVar17);
            if (uVar18 < count) {
              Vector::Slice((Vector *)local_180,sel,uVar18);
              Vector::Slice(pvVar17,sel,uVar18);
            }
            pvVar15 = vector<duckdb::JoinCondition,_true>::operator[](local_1e8,sVar23);
            uVar18 = PhysicalRangeJoin::SelectJoinTail
                               (&pvVar15->comparison,(Vector *)local_180,pvVar17,sel,uVar18,
                                local_278);
            if (local_120.handle.internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_120.handle.internal.
                         super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ;
            }
            if (local_138.handle.internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_138.handle.internal.
                         super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_150.handle.internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_150.handle.internal.
                         super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            LogicalType::~LogicalType((LogicalType *)(local_180 + 8));
            sVar23 = sVar23 + 1;
            this_00 = local_298;
            sel = local_278;
          } while (sVar23 < (ulong)(((long)*(pointer *)
                                            ((long)&(local_280->super_PhysicalRangeJoin).
                                                    super_PhysicalComparisonJoin.conditions.
                                                                                                        
                                                  super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                                  .
                                                  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                     (long)(local_280->super_PhysicalRangeJoin).
                                           super_PhysicalComparisonJoin.conditions.
                                           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                           .
                                           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x5555555555555555));
        }
        DataChunk::Fuse(local_2b0,local_290);
        if (uVar18 < count) {
          if (uVar18 == 0) {
            DataChunk::Reset(local_2b0);
            count = 0;
          }
          else {
            DataChunk::Slice(local_2b0,sel,uVar18);
            count = uVar18;
          }
        }
      }
      if ((*(char *)&state_p[0x10]._vptr_OperatorState == '\x01') && (count != 0)) {
        psVar8 = sel->sel_vector;
        uVar18 = 0;
        do {
          uVar22 = uVar18;
          if (psVar8 != (sel_t *)0x0) {
            uVar22 = (ulong)psVar8[uVar18];
          }
          if (*(char *)&state_p[0x10]._vptr_OperatorState == '\x01') {
            *(undefined1 *)
             ((long)state_p[0x11]._vptr_OperatorState + (ulong)local_210.sel_vector[uVar22]) = 1;
          }
          uVar18 = uVar18 + 1;
        } while (count != uVar18);
      }
      pGVar11 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                              *)this_00);
      if (((pGVar11->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
           super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
           super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
           super__Head_base<0UL,_bool_*,_false>._M_head_impl != (bool *)0x0) && (count != 0)) {
        uVar18 = 0;
        do {
          pGVar11 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                    ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                                  *)this_00);
          uVar22 = uVar18;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar22 = (ulong)sel->sel_vector[uVar18];
          }
          *(bool *)((long)state_p[0x28]._vptr_OperatorState +
                   (long)((pGVar11->found_match).
                          super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
                          super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                          super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                          super__Head_base<0UL,_bool_*,_false>._M_head_impl +
                         local_248.sel_vector[uVar22])) = true;
          uVar18 = uVar18 + 1;
        } while (count != uVar18);
      }
      local_2b0->count = count;
      DataChunk::Verify(local_2b0);
    }
    if (local_248.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_248.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_210.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_210.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_2b0->count != 0) {
      return HAVE_MORE_OUTPUT;
    }
  } while( true );
}

Assistant:

OperatorResultType PhysicalPiecewiseMergeJoin::ResolveComplexJoin(ExecutionContext &context, DataChunk &input,
                                                                  DataChunk &chunk, OperatorState &state_p) const {
	auto &state = state_p.Cast<PiecewiseMergeJoinState>();
	auto &gstate = sink_state->Cast<MergeJoinGlobalState>();
	auto &rsorted = *gstate.table->global_sort_state.sorted_blocks[0];
	const auto left_cols = input.ColumnCount();
	const auto tail_cols = conditions.size() - 1;

	state.payload_heap_handles.clear();
	do {
		if (state.first_fetch) {
			state.ResolveJoinKeys(input);

			state.right_chunk_index = 0;
			state.right_base = 0;
			state.left_position = 0;
			state.prev_left_index = 0;
			state.right_position = 0;
			state.first_fetch = false;
			state.finished = false;
		}
		if (state.finished) {
			if (state.left_outer.Enabled()) {
				// left join: before we move to the next chunk, see if we need to output any vectors that didn't
				// have a match found
				state.left_outer.ConstructLeftJoinResult(state.lhs_payload, chunk);
				state.left_outer.Reset();
			}
			state.first_fetch = true;
			state.finished = false;
			return OperatorResultType::NEED_MORE_INPUT;
		}

		auto &lhs_table = *state.lhs_local_table;
		const auto lhs_not_null = lhs_table.count - lhs_table.has_null;
		BlockMergeInfo left_info(*state.lhs_global_state, 0, state.left_position, lhs_not_null);

		const auto &rblock = *rsorted.radix_sorting_data[state.right_chunk_index];
		const auto rhs_not_null =
		    SortedBlockNotNull(state.right_base, rblock.count, gstate.table->count - gstate.table->has_null);
		BlockMergeInfo right_info(gstate.table->global_sort_state, state.right_chunk_index, state.right_position,
		                          rhs_not_null);

		idx_t result_count =
		    MergeJoinComplexBlocks(left_info, right_info, conditions[0].comparison, state.prev_left_index);
		if (result_count == 0) {
			// exhausted this chunk on the right side
			// move to the next right chunk
			state.left_position = 0;
			state.right_position = 0;
			state.right_base += rsorted.radix_sorting_data[state.right_chunk_index]->count;
			state.right_chunk_index++;
			if (state.right_chunk_index >= rsorted.radix_sorting_data.size()) {
				state.finished = true;
			}
		} else {
			// found matches: extract them
			chunk.Reset();
			for (idx_t c = 0; c < state.lhs_payload.ColumnCount(); ++c) {
				chunk.data[c].Slice(state.lhs_payload.data[c], left_info.result, result_count);
			}
			state.payload_heap_handles.push_back(SliceSortedPayload(chunk, right_info.state, right_info.block_idx,
			                                                        right_info.result, result_count, left_cols));
			chunk.SetCardinality(result_count);

			auto sel = FlatVector::IncrementalSelectionVector();
			if (tail_cols) {
				// If there are more expressions to compute,
				// split the result chunk into the left and right halves
				// so we can compute the values for comparison.
				chunk.Split(state.rhs_input, left_cols);
				state.rhs_executor.SetChunk(state.rhs_input);
				state.rhs_keys.Reset();

				auto tail_count = result_count;
				for (size_t cmp_idx = 1; cmp_idx < conditions.size(); ++cmp_idx) {
					Vector left(lhs_table.keys.data[cmp_idx]);
					left.Slice(left_info.result, result_count);

					auto &right = state.rhs_keys.data[cmp_idx];
					state.rhs_executor.ExecuteExpression(cmp_idx, right);

					if (tail_count < result_count) {
						left.Slice(*sel, tail_count);
						right.Slice(*sel, tail_count);
					}
					tail_count =
					    SelectJoinTail(conditions[cmp_idx].comparison, left, right, sel, tail_count, &state.sel);
					sel = &state.sel;
				}
				chunk.Fuse(state.rhs_input);

				if (tail_count < result_count) {
					result_count = tail_count;
					if (result_count == 0) {
						// Need to reset here otherwise we may use the non-flat chunk when constructing LEFT/OUTER
						chunk.Reset();
					} else {
						chunk.Slice(*sel, result_count);
					}
				}
			}

			// found matches: mark the found matches if required
			if (state.left_outer.Enabled()) {
				for (idx_t i = 0; i < result_count; i++) {
					state.left_outer.SetMatch(left_info.result[sel->get_index(i)]);
				}
			}
			if (gstate.table->found_match) {
				//	Absolute position of the block + start position inside that block
				for (idx_t i = 0; i < result_count; i++) {
					gstate.table->found_match[state.right_base + right_info.result[sel->get_index(i)]] = true;
				}
			}
			chunk.SetCardinality(result_count);
			chunk.Verify();
		}
	} while (chunk.size() == 0);
	return OperatorResultType::HAVE_MORE_OUTPUT;
}